

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int CVmObjBigNum::s_getp_pi(vm_val_t *val,uint *argc)

{
  char *dst;
  int iVar1;
  vm_obj_id_t vVar2;
  char *src;
  
  if (s_getp_pi(vm_val_t*,unsigned_int*)::desc == '\0') {
    s_getp_pi();
  }
  iVar1 = CVmObject::get_prop_check_argc(val,argc,&s_getp_pi::desc);
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    vVar2 = create(0,(long)iVar1);
    val->typ = VM_OBJ;
    (val->val).obj = vVar2;
    dst = *(char **)((long)&G_obj_table_X.pages_[vVar2 >> 0xc][vVar2 & 0xfff].ptr_ + 8);
    src = cache_pi((long)iVar1);
    copy_val(dst,src,1);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::s_getp_pi(VMG_ vm_val_t *val, uint *argc)
{
    size_t prec;
    char *new_ext;
    const char *pi;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* get the precision argument */
    prec = CVmBif::pop_int_val(vmg0_);

    /* allocate the result */
    val->set_obj(create(vmg_ FALSE, prec));
    new_ext = get_objid_ext(vmg_ val->val.obj);

    /* cache pi to the required precision */
    pi = cache_pi(prec);

    /* return the value */
    copy_val(new_ext, pi, TRUE);

    /* handled */
    return TRUE;
}